

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

size_t __thiscall std::hash<docopt::value>::operator()(hash<docopt::value> *this,value *val)

{
  size_t sVar1;
  value *val_local;
  hash<docopt::value> *this_local;
  
  sVar1 = docopt::value::hash(val);
  return sVar1;
}

Assistant:

size_t operator()(docopt::value const& val) const noexcept {
			return val.hash();
		}